

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

bool tchecker::ta::has_diagonal_constraint(system_t *system)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  bool bVar4;
  has_clock_constraints_t hVar5;
  const_iterator cVar6;
  typed_expression_t *ptVar7;
  const_iterator cVar8;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar9;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar10;
  
  rVar9 = tchecker::system::locs_t::locations(&(system->super_system_t).super_system_t.super_locs_t)
  ;
  cVar6._M_current =
       (shared_ptr<tchecker::system::loc_t> *)rVar9._begin.super_const_iterator._M_current;
  do {
    bVar4 = (const_iterator)cVar6._M_current !=
            rVar9._end.super_const_iterator._M_current.super_const_iterator;
    if (!bVar4) {
LAB_001778bb:
      rVar10 = tchecker::system::edges_t::edges
                         (&(system->super_system_t).super_system_t.super_edges_t);
      cVar8._M_current =
           (shared_ptr<tchecker::system::edge_t> *)rVar10._begin.super_const_iterator._M_current;
      while( true ) {
        bVar4 = (const_iterator)cVar8._M_current !=
                rVar10._end.super_const_iterator._M_current.super_const_iterator;
        if (!bVar4) {
          return bVar4;
        }
        peVar3 = ((cVar8._M_current)->
                 super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var2 = ((cVar8._M_current)->
                 super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        ptVar7 = system_t::guard(system,peVar3->_id);
        hVar5 = has_clock_constraints(ptVar7);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if (((ushort)hVar5 >> 8 & 1) != 0) break;
        cVar8._M_current = cVar8._M_current + 1;
      }
      return bVar4;
    }
    peVar1 = ((cVar6._M_current)->
             super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = ((cVar6._M_current)->
             super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    ptVar7 = system_t::invariant(system,peVar1->_id);
    hVar5 = has_clock_constraints(ptVar7);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (((ushort)hVar5 >> 8 & 1) != 0) {
      if (bVar4) {
        return true;
      }
      goto LAB_001778bb;
    }
    cVar6._M_current = cVar6._M_current + 1;
  } while( true );
}

Assistant:

bool has_diagonal_constraint(tchecker::ta::system_t const & system)
{
  // Check location invariants
  for (tchecker::system::loc_const_shared_ptr_t const & loc : system.locations()) {
    tchecker::has_clock_constraints_t invariant_has_clock_constraints =
        tchecker::has_clock_constraints(system.invariant(loc->id()));
    if (invariant_has_clock_constraints.diagonal)
      return true;
  }

  // Check edge guards
  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    tchecker::has_clock_constraints_t guard_has_clock_constrains = tchecker::has_clock_constraints(system.guard(edge->id()));
    if (guard_has_clock_constrains.diagonal)
      return true;
  }

  return false;
}